

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumnSortSpecs *__dest;
  ImGuiTableColumnSortSpecs *pIVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  TableSortSpecsSanitize(table);
  iVar10 = (table->SortSpecsMulti).Capacity;
  uVar4._0_1_ = table->SortSpecsCount;
  uVar4._1_1_ = table->ColumnsEnabledCount;
  uVar4._2_1_ = table->ColumnsEnabledFixedCount;
  uVar4._3_1_ = table->DeclColumnsCount;
  cVar3 = '\0';
  if ('\x01' < (char)(undefined1)uVar4) {
    cVar3 = (undefined1)uVar4;
  }
  iVar7 = (int)cVar3;
  if (iVar10 < iVar7) {
    if (iVar10 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar10 / 2 + iVar10;
    }
    if (iVar10 <= iVar7) {
      iVar10 = iVar7;
    }
    __dest = (ImGuiTableColumnSortSpecs *)MemAlloc((long)iVar10 * 0xc);
    pIVar2 = (table->SortSpecsMulti).Data;
    if (pIVar2 != (ImGuiTableColumnSortSpecs *)0x0) {
      memcpy(__dest,pIVar2,(long)(table->SortSpecsMulti).Size * 0xc);
      MemFree((table->SortSpecsMulti).Data);
    }
    (table->SortSpecsMulti).Data = __dest;
    (table->SortSpecsMulti).Capacity = iVar10;
    uVar4 = (uint)(byte)table->SortSpecsCount;
  }
  (table->SortSpecsMulti).Size = iVar7;
  cVar3 = (char)uVar4;
  if (cVar3 == '\0') {
    pIVar2 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else if ((uVar4 & 0xff) == 1) {
    pIVar2 = &table->SortSpecsSingle;
  }
  else {
    pIVar2 = (table->SortSpecsMulti).Data;
  }
  iVar10 = table->ColumnsCount;
  if (0 < iVar10) {
    lVar5 = 100;
    sVar6 = 0;
    lVar8 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      cVar3 = *(char *)((long)pIVar1 + lVar5 + -0xe);
      lVar9 = (long)cVar3;
      if (lVar9 != -1) {
        pIVar2[lVar9].ColumnUserID = *(ImGuiID *)((long)pIVar1 + lVar5 + -0x34);
        pIVar2[lVar9].ColumnIndex = (short)(char)((ushort)sVar6 >> 8);
        pIVar2[lVar9].SortOrder = (short)cVar3;
        pIVar2[lVar9].field_0x8 = *(byte *)((long)&pIVar1->Flags + lVar5) & 3;
        iVar10 = table->ColumnsCount;
      }
      lVar8 = lVar8 + 1;
      sVar6 = sVar6 + 0x100;
      lVar5 = lVar5 + 0x68;
    } while (lVar8 < iVar10);
    cVar3 = table->SortSpecsCount;
  }
  (table->SortSpecs).Specs = pIVar2;
  (table->SortSpecs).SpecsCount = (int)cVar3;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        IM_ASSERT(column->SortOrder < table->SortSpecsCount);
        ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
        sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}